

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoomCreateView.cpp
# Opt level: O1

void __thiscall RoomCreateView::display(RoomCreateView *this)

{
  uint __val;
  uint uVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  int strength;
  uint uVar6;
  RoomCreateUpdateForm *this_00;
  long lVar7;
  long *plVar8;
  Controller *this_01;
  View *pVVar9;
  uint uVar10;
  long *plVar11;
  size_type *psVar12;
  ulong uVar13;
  uint __len;
  Room room;
  string local_a8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  Room local_48;
  undefined4 extraout_var;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"To create a room fill in the details asked below: \n",0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter room number: ",0x13);
  iVar5 = Input::getInt();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enter strength: ",0x10);
  strength = Input::getInt();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Audio required? (y/n): ",0x17);
  cVar2 = Input::getChar();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Video required? (y/n): ",0x17);
  cVar3 = Input::getChar();
  this_00 = (RoomCreateUpdateForm *)operator_new(0x38);
  RoomCreateUpdateForm::RoomCreateUpdateForm
            (this_00,iVar5,strength,cVar2 == 'y',cVar3 == 'y',(Room *)0x0);
  (this->super_CreateView<Room>).form = (ModelForm<Room> *)this_00;
  bVar4 = Form::isValid((Form *)this_00);
  if (bVar4) {
    iVar5 = (*(((this->super_CreateView<Room>).form)->super_Form)._vptr_Form[1])();
    lVar7 = CONCAT44(extraout_var,iVar5);
    local_48.super_Model<Room>.id = *(int *)(lVar7 + 8);
    local_48.super_Model<Room>._vptr_Model = (_func_int **)&PTR_save_0012e060;
    local_48._20_2_ = *(undefined2 *)(lVar7 + 0x14);
    local_48._12_8_ = *(undefined8 *)(lVar7 + 0xc);
    uVar6 = Room::getRoomNumber(&local_48);
    __val = -uVar6;
    if (0 < (int)uVar6) {
      __val = uVar6;
    }
    __len = 1;
    if (9 < __val) {
      uVar13 = (ulong)__val;
      uVar1 = 4;
      do {
        __len = uVar1;
        uVar10 = (uint)uVar13;
        if (uVar10 < 100) {
          __len = __len - 2;
          goto LAB_0010aef8;
        }
        if (uVar10 < 1000) {
          __len = __len - 1;
          goto LAB_0010aef8;
        }
        if (uVar10 < 10000) goto LAB_0010aef8;
        uVar13 = uVar13 / 10000;
        uVar1 = __len + 4;
      } while (99999 < uVar10);
      __len = __len + 1;
    }
LAB_0010aef8:
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct((ulong)local_68,(char)__len - (char)((int)uVar6 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>(local_68[0] + (uVar6 >> 0x1f),__len,__val);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)local_68,0,(char *)0x0,0x12163e);
    plVar11 = plVar8 + 2;
    if ((long *)*plVar8 == plVar11) {
      local_78 = *plVar11;
      lStack_70 = plVar8[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *plVar11;
      local_88 = (long *)*plVar8;
    }
    local_80 = plVar8[1];
    *plVar8 = (long)plVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_88);
    psVar12 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_a8.field_2._M_allocated_capacity = *psVar12;
      local_a8.field_2._8_8_ = plVar8[3];
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    }
    else {
      local_a8.field_2._M_allocated_capacity = *psVar12;
      local_a8._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_a8._M_string_length = plVar8[1];
    *plVar8 = (long)psVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_a8._M_dataplus._M_p,local_a8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88);
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0]);
    }
  }
  else {
    Form::printErrors(&((this->super_CreateView<Room>).form)->super_Form);
  }
  this_01 = Controller::getInstance();
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"admin-panel","");
  pVVar9 = Controller::getView(this_01,&local_a8);
  View::response->view = pVVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void RoomCreateView::display() {
    cout << "To create a room fill in the details asked below: \n";
    int roomNumber, strength;
    bool audio, video;
    cout << "Enter room number: ";
    roomNumber = Input::getInt();
    cout << "Enter strength: ";
    strength = Input::getInt();
    cout << "Audio required? (y/n): ";
    audio = (Input::getChar() == 'y');
    cout << "Video required? (y/n): ";
    video = (Input::getChar() == 'y');
    form = new RoomCreateUpdateForm(roomNumber, strength, audio, video);
    if (form->isValid()) {
        Room room = form->save();
        cout << "Room #" + to_string(room.getRoomNumber()) + " created successfully.\n";
    } else {
        form->printErrors();
    }
    response->view = Controller::getInstance().getView("admin-panel");
}